

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_dummy_when
                 (lyd_node *first,lyd_node *parent,lysc_node *snode,lysc_when **disabled)

{
  uint32_t local_44;
  lyd_node *plStack_40;
  uint32_t xp_opts;
  lyd_node *dummy;
  lyd_node *tree;
  lysc_when **pplStack_28;
  LY_ERR rc;
  lysc_when **disabled_local;
  lysc_node *snode_local;
  lyd_node *parent_local;
  lyd_node *first_local;
  
  tree._4_4_ = 0;
  plStack_40 = (lyd_node *)0x0;
  dummy = parent;
  pplStack_28 = disabled;
  disabled_local = (lysc_when **)snode;
  snode_local = (lysc_node *)parent;
  parent_local = first;
  if (parent == (lyd_node *)0x0) {
    dummy = lyd_first_sibling(first);
  }
  else {
    for (; dummy->parent != (lyd_node_inner *)0x0; dummy = lyd_parent(dummy)) {
    }
    dummy = lyd_first_sibling(dummy);
  }
  tree._4_4_ = lyd_new_opaq((lyd_node *)snode_local,(ly_ctx *)disabled_local[1]->cond,
                            (char *)disabled_local[5],(char *)0x0,(char *)0x0,
                            (char *)disabled_local[1]->context,&stack0xffffffffffffffc0);
  if (tree._4_4_ == LY_SUCCESS) {
    if (snode_local == (lysc_node *)0x0) {
      if (parent_local == (lyd_node *)0x0) {
        if (dummy != (lyd_node *)0x0) {
          __assert_fail("!tree",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,0x40e,
                        "LY_ERR lyd_validate_dummy_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, const struct lysc_when **)"
                       );
        }
        dummy = plStack_40;
      }
      else {
        lyd_insert_sibling(parent_local,plStack_40,&dummy);
      }
    }
    if (((ulong)*disabled_local & 0x10000) == 0) {
      local_44 = 0x80;
    }
    else {
      local_44 = 0x100;
    }
    tree._4_4_ = lyd_validate_node_when
                           (dummy,plStack_40,(lysc_node *)disabled_local,local_44,pplStack_28);
    if (tree._4_4_ == LY_EINCOMPLETE) {
      ly_log((ly_ctx *)disabled_local[1]->cond,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c",
             0x41e);
      tree._4_4_ = LY_EINT;
    }
  }
  lyd_free_tree(plStack_40);
  return tree._4_4_;
}

Assistant:

static LY_ERR
lyd_validate_dummy_when(const struct lyd_node *first, const struct lyd_node *parent, const struct lysc_node *snode,
        const struct lysc_when **disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *tree, *dummy = NULL;
    uint32_t xp_opts;

    /* find root */
    if (parent) {
        tree = (struct lyd_node *)parent;
        while (tree->parent) {
            tree = lyd_parent(tree);
        }
        tree = lyd_first_sibling(tree);
    } else {
        /* is the first sibling from the same module, but may not be the actual first */
        tree = lyd_first_sibling(first);
    }

    /* create dummy opaque node */
    rc = lyd_new_opaq((struct lyd_node *)parent, snode->module->ctx, snode->name, NULL, NULL, snode->module->name, &dummy);
    LY_CHECK_GOTO(rc, cleanup);

    /* connect it if needed */
    if (!parent) {
        if (first) {
            lyd_insert_sibling((struct lyd_node *)first, dummy, &tree);
        } else {
            assert(!tree);
            tree = dummy;
        }
    }

    /* explicitly specified accesible tree */
    if (snode->flags & LYS_CONFIG_W) {
        xp_opts = LYXP_ACCESS_TREE_CONFIG;
    } else {
        xp_opts = LYXP_ACCESS_TREE_ALL;
    }

    /* evaluate all when */
    rc = lyd_validate_node_when(tree, dummy, snode, xp_opts, disabled);
    if (rc == LY_EINCOMPLETE) {
        /* all other when must be resolved by now */
        LOGINT(snode->module->ctx);
        rc = LY_EINT;
        goto cleanup;
    } else if (rc) {
        /* error */
        goto cleanup;
    }

cleanup:
    lyd_free_tree(dummy);
    return rc;
}